

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O1

int mbedtls_md_hmac(mbedtls_md_info_t *md_info,uchar *key,size_t keylen,uchar *input,size_t ilen,
                   uchar *output)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  mbedtls_md_context_t ctx;
  mbedtls_md_context_t local_58;
  uchar *local_40;
  size_t local_38;
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    return -0x5100;
  }
  local_58.md_info = (mbedtls_md_info_t *)0x0;
  local_58.md_ctx = (void *)0x0;
  local_58.hmac_ctx = (void *)0x0;
  local_40 = output;
  local_38 = ilen;
  pvVar3 = (*md_info->ctx_alloc_func)();
  iVar2 = -0x5180;
  local_58.md_ctx = pvVar3;
  if (pvVar3 != (void *)0x0) {
    local_58.hmac_ctx = calloc(2,(long)md_info->block_size);
    if (local_58.hmac_ctx != (void *)0x0) {
      iVar2 = 0;
      bVar1 = true;
      local_58.md_info = md_info;
      goto LAB_00118161;
    }
    (*md_info->ctx_free_func)(pvVar3);
  }
  bVar1 = false;
LAB_00118161:
  if ((bVar1) && (iVar2 = mbedtls_md_hmac_starts(&local_58,key,keylen), iVar2 == 0)) {
    iVar2 = -0x5100;
    if ((local_58.md_info != (mbedtls_md_info_t *)0x0) && (local_58.hmac_ctx != (void *)0x0)) {
      iVar2 = (*(local_58.md_info)->update_func)(local_58.md_ctx,input,local_38);
    }
    if (iVar2 == 0) {
      iVar2 = mbedtls_md_hmac_finish(&local_58,local_40);
    }
  }
  mbedtls_md_free(&local_58);
  return iVar2;
}

Assistant:

int mbedtls_md_hmac( const mbedtls_md_info_t *md_info,
                     const unsigned char *key, size_t keylen,
                     const unsigned char *input, size_t ilen,
                     unsigned char *output )
{
    mbedtls_md_context_t ctx;
    int ret;

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 1 ) ) != 0 )
        goto cleanup;

    if( ( ret = mbedtls_md_hmac_starts( &ctx, key, keylen ) ) != 0 )
        goto cleanup;
    if( ( ret = mbedtls_md_hmac_update( &ctx, input, ilen ) ) != 0 )
        goto cleanup;
    if( ( ret = mbedtls_md_hmac_finish( &ctx, output ) ) != 0 )
        goto cleanup;

cleanup:
    mbedtls_md_free( &ctx );

    return( ret );
}